

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void runExperiment(cpu_set_t *cpuset,int numOfThreads,int repeat,bool useTraditional)

{
  pthread_t pVar1;
  long *plVar2;
  undefined8 uVar3;
  long lVar4;
  __cpu_mask *p_Var5;
  __start_routine *p_Var6;
  int iVar7;
  int iVar8;
  long *plVar9;
  ostream *poVar10;
  undefined7 in_register_00000009;
  ulong uVar11;
  ulong uVar12;
  int i;
  uint *puVar13;
  uint *__arg;
  long lVar14;
  long lVar15;
  long lVar16;
  ulong uStack_60;
  cpu_set_t *local_58;
  ulong local_50;
  int local_44;
  __start_routine *local_40;
  int local_34;
  
  local_34 = (int)CONCAT71(in_register_00000009,useTraditional);
  local_58 = cpuset;
  uVar12 = (ulong)(uint)numOfThreads;
  lVar4 = -0x58 - (uVar12 * 8 + 0xf & 0xfffffffffffffff0);
  puVar13 = (uint *)((long)&local_58 + (lVar4 - (uVar12 * 4 + 0xf & 0xfffffffffffffff0)) + 0x58);
  lVar15 = 0;
  puVar13[-2] = 0xffffffff;
  puVar13[-1] = 0xffffffff;
  uVar11 = *(ulong *)(puVar13 + -2);
  if (0 < numOfThreads) {
    uVar11 = uVar12 << 3;
  }
  local_50 = 0;
  if (0 < numOfThreads) {
    local_50 = (ulong)(uint)numOfThreads;
  }
  local_44 = numOfThreads;
  puVar13[-2] = 0x102a1f;
  puVar13[-1] = 0;
  plVar9 = (long *)operator_new__(uVar11);
  *plVar9 = 0;
  local_40 = (__start_routine *)(uVar11 - 8);
  puVar13[-2] = 0x102a39;
  puVar13[-1] = 0;
  memset(plVar9 + 1,0,uVar11 - 8);
  puVar13[-2] = 0x102a48;
  puVar13[-1] = 0;
  throughputDelete = plVar9;
  plVar9 = (long *)operator_new__(uVar11);
  p_Var6 = local_40;
  *plVar9 = 0;
  puVar13[-2] = 0x102a5e;
  puVar13[-1] = 0;
  memset(plVar9 + 1,0,(size_t)p_Var6);
  puVar13[-2] = 0x102a6d;
  puVar13[-1] = 0;
  throughputInsert = plVar9;
  plVar9 = (long *)operator_new__(uVar11);
  p_Var6 = local_40;
  *plVar9 = 0;
  puVar13[-2] = 0x102a83;
  puVar13[-1] = 0;
  memset(plVar9 + 1,0,(size_t)p_Var6);
  local_40 = RunTraditionalPQExperiment;
  if (local_34 == 0) {
    local_40 = RunCPQExperiment;
  }
  uVar12 = 0;
  __arg = puVar13;
  throughputRandom = plVar9;
  while( true ) {
    if (local_50 == uVar12) {
      lVar16 = 0;
      lVar14 = 0;
      lVar15 = 0;
      for (uVar12 = 0; local_50 != uVar12; uVar12 = uVar12 + 1) {
        pVar1 = *(pthread_t *)((long)&local_58 + uVar12 * 8 + lVar4 + 0x58);
        puVar13[-2] = 0x102b43;
        puVar13[-1] = 0;
        pthread_join(pVar1,(void **)0x0);
        lVar16 = lVar16 + throughputDelete[uVar12];
        lVar14 = lVar14 + throughputInsert[uVar12];
        lVar15 = lVar15 + throughputRandom[uVar12];
      }
      puVar13[-2] = 5;
      puVar13[-1] = 0;
      lVar4 = *(long *)(puVar13 + -2);
      plVar2 = throughputByThread[(long)local_44 + -1];
      uVar12 = (ulong)((uint)(byte)((byte)local_34 ^ 1) * 0x18);
      *(long *)((long)plVar2 + uVar12) = *(long *)((long)plVar2 + uVar12) + lVar14 / lVar4;
      plVar9 = (long *)((long)plVar2 + uVar12 + 8);
      *plVar9 = *plVar9 + lVar16 / lVar4;
      plVar2 = (long *)((long)plVar2 + uVar12 + 0x10);
      *plVar2 = *plVar2 + lVar15 / lVar4;
      return;
    }
    *__arg = (uint)uVar12;
    p_Var6 = local_40;
    puVar13[-2] = 0x102ac2;
    puVar13[-1] = 0;
    iVar7 = pthread_create((pthread_t *)((long)&local_58 + lVar15 + lVar4 + 0x58),
                           (pthread_attr_t *)0x0,p_Var6,__arg);
    pVar1 = *(pthread_t *)((long)&local_58 + uVar12 * 8 + lVar4 + 0x58);
    p_Var5 = local_58->__bits;
    puVar13[-2] = 0x102ae0;
    puVar13[-1] = 0;
    iVar8 = pthread_setaffinity_np
                      (pVar1,0x80,(cpu_set_t *)((long)p_Var5 + (ulong)(((uint)uVar12 & 7) << 7)));
    if (iVar8 != 0) break;
    uVar12 = uVar12 + 1;
    lVar15 = lVar15 + 8;
    __arg = __arg + 1;
    if (iVar7 != 0) {
      puVar13[-2] = 0x102b0b;
      puVar13[-1] = 0;
      poVar10 = std::operator<<((ostream *)&std::cout,"Error: thread wasn\'t created,");
      puVar13[-2] = 0x102b16;
      puVar13[-1] = 0;
      poVar10 = (ostream *)std::ostream::operator<<(poVar10,iVar7);
      puVar13[-2] = 0x102b1e;
      puVar13[-1] = 0;
      std::endl<char,std::char_traits<char>>(poVar10);
      puVar13[-2] = 0xffffffff;
      puVar13[-1] = 0xffffffff;
      uVar3 = *(undefined8 *)(puVar13 + -2);
      puVar13[-2] = 0x102b26;
      puVar13[-1] = 0;
      exit((int)uVar3);
    }
  }
  puVar13[-2] = 0x102bcd;
  puVar13[-1] = 0;
  printf("Thread %d affinities was not set",uVar12 & 0xffffffff);
  *(code **)(puVar13 + -2) = main;
  pthread_exit((void *)0x0);
}

Assistant:

void runExperiment(const cpu_set_t *cpuset, int numOfThreads, int repeat, bool useTraditional) {
    pthread_t threads[numOfThreads];
    struct threadData td[numOfThreads];
    throughputDelete = new long[numOfThreads]{0};
    throughputInsert = new long[numOfThreads]{0};
    throughputRandom = new long[numOfThreads]{0};
    void *(*routine)(void *) = useTraditional ? RunTraditionalPQExperiment : RunCPQExperiment;

    for (int i = 0; i < numOfThreads; i++) {
        td[i].threadId = i;

        int rc = pthread_create(&threads[i], nullptr, routine, (void *) &td[i]);

        int s = pthread_setaffinity_np(threads[i], sizeof(cpu_set_t), &cpuset[i % CORES]);
        if (s != 0) {
            printf("Thread %d affinities was not set", i);
            pthread_exit(nullptr);
        }

        if (rc) {
            cout << "Error: thread wasn't created," << rc << endl;
            exit(-1);
        }
    }

    long throughputDeleteSum = 0;
    long throughputInsertSum = 0;
    long throughputRandomSum = 0;

    for (int i = 0; i < numOfThreads; i++) {
        pthread_join(threads[i], nullptr);

        throughputDeleteSum += throughputDelete[i];
        throughputInsertSum += throughputInsert[i];
        throughputRandomSum += throughputRandom[i];
    }

//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT PUSH: " << throughputInsertSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT POP: " << throughputDeleteSum
//         << endl;
//    cout << "SUM " << (useTraditional ? "TRADITIONAL" : "RELAXED") << " THROUGHPUT RANDOM: " << throughputRandomSum
//         << endl;

    int relaxedOffset = useTraditional ? 0 : 3;
    throughputByThread[numOfThreads - 1][relaxedOffset] += throughputInsertSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 1] += throughputDeleteSum / REPEATS;
    throughputByThread[numOfThreads - 1][relaxedOffset + 2] += throughputRandomSum / REPEATS;

//    delete throughputDelete;
//    delete throughputInsert;
//    delete throughputRandom;
}